

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

Cell * __thiscall
notch::io::CSVReader::parseCell(Cell *__return_storage_ptr__,CSVReader *this,string *s)

{
  char *__nptr;
  float fVar1;
  char *parseEnd;
  allocator local_29;
  char *local_28;
  
  __nptr = (s->_M_dataplus)._M_p;
  local_28 = (char *)0x0;
  fVar1 = strtof(__nptr,&local_28);
  if (local_28 == __nptr || local_28 == (char *)0x0) {
    __return_storage_ptr__->tag = String;
    __return_storage_ptr__->value = 0.0;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->str,(string *)s);
  }
  else {
    __return_storage_ptr__->tag = Number;
    __return_storage_ptr__->value = fVar1;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->str,"",&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

Cell parseCell(const std::string &s) {
        // float value = std::stof(s); // doesn't work on MinGW-32; BUG #52015
        const char *parseBegin = s.c_str();
        char *parseEnd = nullptr;
        float value = strtof(parseBegin, &parseEnd);
        if (parseEnd == parseBegin || parseEnd == nullptr) {
            return Cell { CellTag::String, 0.0, s };
        } else {
            return Cell { CellTag::Number, value, "" };
        }
    }